

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::verifyMultisampleLineGroupRasterization
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               ClipMode clipMode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<float,_4> local_1f8;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  Vector<float,_4> local_1c8;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vector<float,_2> local_198;
  Vector<float,_2> local_190;
  Vector<float,_2> local_188;
  Vector<float,_2> local_180;
  Vector<float,_2> local_178;
  Vector<float,_2> local_170;
  Vector<float,_2> local_168;
  Vector<float,_2> local_160;
  Vector<float,_2> local_158;
  Vector<float,_2> local_150;
  Vector<float,_2> local_148;
  Vector<float,_2> local_140;
  Vector<float,_2> local_138;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vector<float,_2> local_110;
  Vector<float,_2> local_108;
  Vector<float,_2> local_100;
  Vector<float,_2> local_f8;
  Vec2 lineQuadScreenSpace [4];
  Vector<float,_2> local_d0;
  Vec2 lineNormalDir;
  Vector<float,_2> local_c0;
  Vec2 lineDir;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vector<float,_2> local_a0;
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vec2 lineScreenSpace [2];
  Vec2 lineNormalizedDeviceSpace [2];
  int local_60;
  int lineNdx;
  undefined1 local_50 [8];
  TriangleSceneSpec triangleScene;
  float halfLineWidth;
  Vec2 viewportSize;
  ClipMode clipMode_local;
  TestLog *log_local;
  RasterizationArguments *args_local;
  LineSceneSpec *scene_local;
  Surface *surface_local;
  
  iVar2 = Surface::getWidth(surface);
  iVar3 = Surface::getHeight(surface);
  Vector<float,_2>::Vector
            ((Vector<float,_2> *)
             ((long)&triangleScene.triangles.
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),(float)iVar2,
             (float)iVar3);
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = scene->lineWidth * 0.5;
  TriangleSceneSpec::TriangleSceneSpec((TriangleSceneSpec *)local_50);
  sVar4 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size(&scene->lines);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)local_50,sVar4 * 2);
  local_60 = 0;
  while( true ) {
    sVar4 = std::
            vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
            size(&scene->lines);
    if ((int)sVar4 <= local_60) break;
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar7 = Vector<float,_4>::x(pvVar5->positions);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar8 = Vector<float,_4>::w(pvVar5->positions);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar9 = Vector<float,_4>::y(pvVar5->positions);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar10 = Vector<float,_4>::w(pvVar5->positions);
    Vector<float,_2>::Vector(lineScreenSpace + 1,fVar7 / fVar8,fVar9 / fVar10);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar7 = Vector<float,_4>::x(pvVar5->positions + 1);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar8 = Vector<float,_4>::w(pvVar5->positions + 1);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar9 = Vector<float,_4>::y(pvVar5->positions + 1);
    pvVar5 = std::
             vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
             operator[](&scene->lines,(long)local_60);
    fVar10 = Vector<float,_4>::w(pvVar5->positions + 1);
    Vector<float,_2>::Vector(lineNormalizedDeviceSpace,fVar7 / fVar8,fVar9 / fVar10);
    if (clipMode == CLIPMODE_USE_CLIPPING_BOX) {
      applyClippingBox(lineScreenSpace + 1,1.0);
    }
    Vector<float,_2>::Vector(&local_a0,1.0,1.0);
    tcu::operator+((tcu *)&local_98,lineScreenSpace + 1,&local_a0);
    tcu::operator*((tcu *)&local_90,&local_98,0.5);
    tcu::operator*((tcu *)&local_88,&local_90,
                   (Vector<float,_2> *)
                   ((long)&triangleScene.triangles.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    Vector<float,_2>::Vector(&lineDir,1.0,1.0);
    tcu::operator+((tcu *)&local_b0,lineNormalizedDeviceSpace,&lineDir);
    tcu::operator*((tcu *)&local_a8,&local_b0,0.5);
    tcu::operator*((tcu *)lineScreenSpace,&local_a8,
                   (Vector<float,_2> *)
                   ((long)&triangleScene.triangles.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::operator-((tcu *)&lineNormalDir,lineScreenSpace,&local_88);
    normalize<float,2>((tcu *)&local_c0,&lineNormalDir);
    fVar7 = Vector<float,_2>::y(&local_c0);
    fVar8 = Vector<float,_2>::x(&local_c0);
    Vector<float,_2>::Vector(&local_d0,fVar7,-fVar8);
    tcu::operator*((tcu *)&local_100,&local_d0,
                   triangleScene.triangles.
                   super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    tcu::operator+((tcu *)&local_f8,&local_88,&local_100);
    tcu::operator*((tcu *)&local_108,&local_d0,
                   triangleScene.triangles.
                   super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    tcu::operator-((tcu *)lineQuadScreenSpace,&local_88,&local_108);
    tcu::operator*((tcu *)&local_110,&local_d0,
                   triangleScene.triangles.
                   super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    tcu::operator-((tcu *)(lineQuadScreenSpace + 1),lineScreenSpace,&local_110);
    tcu::operator*((tcu *)(lineQuadNormalizedDeviceSpace + 3),&local_d0,
                   triangleScene.triangles.
                   super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    tcu::operator+((tcu *)(lineQuadScreenSpace + 2),lineScreenSpace,
                   lineQuadNormalizedDeviceSpace + 3);
    tcu::operator/((tcu *)&local_148,&local_f8,
                   (Vector<float,_2> *)
                   ((long)&triangleScene.triangles.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::operator*((tcu *)&local_140,&local_148,2.0);
    Vector<float,_2>::Vector(&local_150,1.0,1.0);
    tcu::operator-((tcu *)&local_138,&local_140,&local_150);
    tcu::operator/((tcu *)&local_160,lineQuadScreenSpace,
                   (Vector<float,_2> *)
                   ((long)&triangleScene.triangles.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::operator*((tcu *)&local_158,&local_160,2.0);
    Vector<float,_2>::Vector(&local_168,1.0,1.0);
    tcu::operator-((tcu *)lineQuadNormalizedDeviceSpace,&local_158,&local_168);
    tcu::operator/((tcu *)&local_178,lineQuadScreenSpace + 1,
                   (Vector<float,_2> *)
                   ((long)&triangleScene.triangles.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::operator*((tcu *)&local_170,&local_178,2.0);
    Vector<float,_2>::Vector(&local_180,1.0,1.0);
    tcu::operator-((tcu *)(lineQuadNormalizedDeviceSpace + 1),&local_170,&local_180);
    tcu::operator/((tcu *)&local_190,lineQuadScreenSpace + 2,
                   (Vector<float,_2> *)
                   ((long)&triangleScene.triangles.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    tcu::operator*((tcu *)&local_188,&local_190,2.0);
    Vector<float,_2>::Vector(&local_198,1.0,1.0);
    tcu::operator-((tcu *)(lineQuadNormalizedDeviceSpace + 2),&local_188,&local_198);
    fVar7 = Vector<float,_2>::x(&local_138);
    fVar8 = Vector<float,_2>::y(&local_138);
    Vector<float,_4>::Vector(&local_1a8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2));
    *(undefined8 *)pvVar6->positions[0].m_data = local_1a8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[0].m_data + 2) = local_1a8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2));
    pvVar6->sharedEdge[0] = false;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace);
    Vector<float,_4>::Vector(&local_1b8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2));
    *(undefined8 *)pvVar6->positions[1].m_data = local_1b8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[1].m_data + 2) = local_1b8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2));
    pvVar6->sharedEdge[1] = false;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace + 1);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace + 1);
    Vector<float,_4>::Vector(&local_1c8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2));
    *(undefined8 *)pvVar6->positions[2].m_data = local_1c8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[2].m_data + 2) = local_1c8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2));
    pvVar6->sharedEdge[2] = true;
    fVar7 = Vector<float,_2>::x(&local_138);
    fVar8 = Vector<float,_2>::y(&local_138);
    Vector<float,_4>::Vector(&local_1d8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2 + 1));
    *(undefined8 *)pvVar6->positions[0].m_data = local_1d8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[0].m_data + 2) = local_1d8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2 + 1));
    pvVar6->sharedEdge[0] = true;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace + 1);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace + 1);
    Vector<float,_4>::Vector(&local_1e8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2 + 1));
    *(undefined8 *)pvVar6->positions[1].m_data = local_1e8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[1].m_data + 2) = local_1e8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2 + 1));
    pvVar6->sharedEdge[1] = false;
    fVar7 = Vector<float,_2>::x(lineQuadNormalizedDeviceSpace + 2);
    fVar8 = Vector<float,_2>::y(lineQuadNormalizedDeviceSpace + 2);
    Vector<float,_4>::Vector(&local_1f8,fVar7,fVar8,0.0,1.0);
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2 + 1));
    *(undefined8 *)pvVar6->positions[2].m_data = local_1f8.m_data._0_8_;
    *(undefined8 *)(pvVar6->positions[2].m_data + 2) = local_1f8.m_data._8_8_;
    pvVar6 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[]((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           *)local_50,(long)(local_60 * 2 + 1));
    pvVar6->sharedEdge[2] = false;
    local_60 = local_60 + 1;
  }
  bVar1 = verifyTriangleGroupRasterization
                    (surface,(TriangleSceneSpec *)local_50,args,log,VERIFICATIONMODE_STRICT);
  TriangleSceneSpec::~TriangleSceneSpec((TriangleSceneSpec *)local_50);
  return bVar1;
}

Assistant:

bool verifyMultisampleLineGroupRasterization (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, ClipMode clipMode)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};

		if (clipMode == CLIPMODE_USE_CLIPPING_BOX)
		{
			applyClippingBox(lineNormalizedDeviceSpace, 1.0f);
		}

		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;
	}

	return verifyTriangleGroupRasterization(surface, triangleScene, args, log);
}